

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module_group.hpp
# Opt level: O1

SerialProcessor<double,_boost::hana::tuple<chains::ProcessorHost<chains::delay::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::delay::Length,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::delay::Length>::_,_chains::Input>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::delay::Length,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::delay::Length>::_,_chains::Input>_>_>,_chains::Parameter<chains::delay::Length>_>_>_>
* __thiscall
chains::
ModuleGroup<chains::SerialProcessor,_chains::ModuleHost<chains::delay::Module,_std::tuple<chains::Parameter<chains::delay::Length>_>,_chains::Expose<chains::delay::Length>_>_>
::makeProcessor<double>
          (SerialProcessor<double,_boost::hana::tuple<chains::ProcessorHost<chains::delay::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::delay::Length,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::delay::Length>::_,_chains::Input>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::delay::Length,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::delay::Length>::_,_chains::Input>_>_>,_chains::Parameter<chains::delay::Length>_>_>_>
           *__return_storage_ptr__,
          ModuleGroup<chains::SerialProcessor,_chains::ModuleHost<chains::delay::Module,_std::tuple<chains::Parameter<chains::delay::Length>_>,_chains::Expose<chains::delay::Length>_>_>
          *this,double sampleRate)

{
  circular_buffer<double,_std::allocator<double>_> *cb;
  tuple<chains::ProcessorHost<chains::delay::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::delay::Length,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::delay::Length>::_,_chains::Input>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::delay::Length,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::delay::Length>::_,_chains::Input>_>_>,_chains::Parameter<chains::delay::Length>_>_>
  moduleProcessors;
  double local_88;
  undefined1 *local_80;
  ebo<boost::hana::detail::bti<0UL>,_boost::hana::pair<boost::hana::type_impl<chains::delay::Length>::_,_chains::Input>,_false>
  local_78;
  circular_buffer<double,_std::allocator<double>_> local_70;
  tuple<chains::ProcessorHost<chains::delay::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::delay::Length,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::delay::Length>::_,_chains::Input>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::delay::Length,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::delay::Length>::_,_chains::Input>_>_>,_chains::Parameter<chains::delay::Length>_>_>
  local_48;
  
  local_80 = (undefined1 *)&local_88;
  local_88 = sampleRate;
  boost::hana::transform_impl<boost::hana::tuple_tag,boost::hana::when<true>>::
  transformer<chains::ModuleGroup<chains::SerialProcessor,chains::ModuleHost<chains::delay::Module,std::tuple<chains::Parameter<chains::delay::Length>>,chains::Expose<chains::delay::Length>>>::makeProcessors<double>(double)const::{lambda(auto:1_const&)#1}*>
  ::operator()(&local_48,
               (transformer<chains::ModuleGroup<chains::SerialProcessor,chains::ModuleHost<chains::delay::Module,std::tuple<chains::Parameter<chains::delay::Length>>,chains::Expose<chains::delay::Length>>>::makeProcessors<double>(double)const::_lambda(auto:1_const&)_1_*>
                *)&local_80,
               (ModuleHost<chains::delay::Module,_std::tuple<chains::Parameter<chains::delay::Length>_>,_chains::Expose<chains::delay::Length>_>
                *)this);
  local_78.data_.super_ebo<boost::hana::detail::pix<1>,_chains::Input,_false>.data_.value_ =
       (pair<boost::hana::type_impl<chains::delay::Length>::_,_chains::Input>)
       (pair<boost::hana::type_impl<chains::delay::Length>::_,_chains::Input>)
       local_48.storage_.
       super_basic_tuple_impl<std::integer_sequence<unsigned_long,_0UL>,_chains::ProcessorHost<chains::delay::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::delay::Length,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::delay::Length>::_,_chains::Input>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::delay::Length,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::delay::Length>::_,_chains::Input>_>_>,_chains::Parameter<chains::delay::Length>_>_>
       .
       super_ebo<boost::hana::detail::bti<0UL>,_chains::ProcessorHost<chains::delay::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::delay::Length,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::delay::Length>::_,_chains::Input>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::delay::Length,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::delay::Length>::_,_chains::Input>_>_>,_chains::Parameter<chains::delay::Length>_>,_false>
       .data_.processor_.inputs_.storage.
       super_basic_tuple_impl<std::integer_sequence<unsigned_long,_0UL>,_boost::hana::pair<boost::hana::type_impl<chains::delay::Length>::_,_chains::Input>_>
       .
       super_ebo<boost::hana::detail::bti<0UL>,_boost::hana::pair<boost::hana::type_impl<chains::delay::Length>::_,_chains::Input>,_false>
       .data_.super_ebo<boost::hana::detail::pix<1>,_chains::Input,_false>.data_.value_;
  cb = (circular_buffer<double,_std::allocator<double>_> *)
       ((long)&local_48.storage_.
               super_basic_tuple_impl<std::integer_sequence<unsigned_long,_0UL>,_chains::ProcessorHost<chains::delay::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::delay::Length,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::delay::Length>::_,_chains::Input>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::delay::Length,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::delay::Length>::_,_chains::Input>_>_>,_chains::Parameter<chains::delay::Length>_>_>
               .
               super_ebo<boost::hana::detail::bti<0UL>,_chains::ProcessorHost<chains::delay::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::delay::Length,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::delay::Length>::_,_chains::Input>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::delay::Length,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::delay::Length>::_,_chains::Input>_>_>,_chains::Parameter<chains::delay::Length>_>,_false>
               .data_.processor_ + 8);
  boost::circular_buffer<double,_std::allocator<double>_>::circular_buffer(&local_70,cb);
  *(pair<boost::hana::type_impl<chains::delay::Length>::_,_chains::Input> *)
   &(__return_storage_ptr__->
    super_ProcessorGroup<boost::hana::tuple<chains::ProcessorHost<chains::delay::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::delay::Length,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::delay::Length>::_,_chains::Input>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::delay::Length,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::delay::Length>::_,_chains::Input>_>_>,_chains::Parameter<chains::delay::Length>_>_>_>
    ).processors_.storage_.
    super_basic_tuple_impl<std::integer_sequence<unsigned_long,_0UL>,_chains::ProcessorHost<chains::delay::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::delay::Length,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::delay::Length>::_,_chains::Input>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::delay::Length,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::delay::Length>::_,_chains::Input>_>_>,_chains::Parameter<chains::delay::Length>_>_>
    .
    super_ebo<boost::hana::detail::bti<0UL>,_chains::ProcessorHost<chains::delay::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::delay::Length,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::delay::Length>::_,_chains::Input>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::delay::Length,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::delay::Length>::_,_chains::Input>_>_>,_chains::Parameter<chains::delay::Length>_>,_false>
    .data_.processor_ =
       local_78.data_.super_ebo<boost::hana::detail::pix<1>,_chains::Input,_false>.data_.value_;
  boost::circular_buffer<double,_std::allocator<double>_>::circular_buffer
            ((circular_buffer<double,_std::allocator<double>_> *)
             ((long)&(__return_storage_ptr__->
                     super_ProcessorGroup<boost::hana::tuple<chains::ProcessorHost<chains::delay::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::delay::Length,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::delay::Length>::_,_chains::Input>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::delay::Length,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::delay::Length>::_,_chains::Input>_>_>,_chains::Parameter<chains::delay::Length>_>_>_>
                     ).processors_.storage_.
                     super_basic_tuple_impl<std::integer_sequence<unsigned_long,_0UL>,_chains::ProcessorHost<chains::delay::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::delay::Length,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::delay::Length>::_,_chains::Input>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::delay::Length,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::delay::Length>::_,_chains::Input>_>_>,_chains::Parameter<chains::delay::Length>_>_>
                     .
                     super_ebo<boost::hana::detail::bti<0UL>,_chains::ProcessorHost<chains::delay::Module::Processor<double,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::delay::Length,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::delay::Length>::_,_chains::Input>_>_>_>,_boost::hana::detail::map_impl<boost::hana::detail::hash_table<boost::hana::detail::bucket<chains::delay::Length,_0UL>_>,_boost::hana::basic_tuple<boost::hana::pair<boost::hana::type_impl<chains::delay::Length>::_,_chains::Input>_>_>,_chains::Parameter<chains::delay::Length>_>,_false>
                     .data_.processor_ + 8),&local_70);
  boost::circular_buffer<double,_std::allocator<double>_>::destroy(&local_70);
  boost::circular_buffer<double,_std::allocator<double>_>::destroy(cb);
  return __return_storage_ptr__;
}

Assistant:

auto makeProcessor(const double sampleRate) const
  {
    auto moduleProcessors = makeProcessors<T>(sampleRate);
    return ProcessorGroup<T, decltype(moduleProcessors)>{moduleProcessors};
  }